

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

int __thiscall
CVmObjFileName::getp_listDir(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  CVmNetFile *this_00;
  undefined8 *puVar4;
  undefined8 uVar5;
  dirent *pdVar6;
  long *plVar7;
  uint uVar8;
  err_frame_t err_cur__;
  vm_rcdesc rc;
  
  if (oargc == (uint *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *oargc;
  }
  if (getp_listDir(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_listDir(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_listDir::desc.min_argc_ = 0;
      getp_listDir::desc.opt_argc_ = 0;
      getp_listDir::desc.varargs_ = 0;
      __cxa_guard_release(&getp_listDir(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,oargc,&getp_listDir::desc);
  if (iVar3 == 0) {
    CVmMetaclass::get_class_obj(metaclass_reg_);
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"FileName.listDir");
    this_00 = CVmObjFile::get_filename_from_obj(self,&rc,0x1004,0xb,"application/octet-stream");
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    err_cur__.prv_ = (err_frame_t *)*puVar4;
    uVar5 = _ZTW11G_err_frame();
    *(err_frame_t **)uVar5 = &err_cur__;
    err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
    if (err_cur__.state_ == 0) {
      pdVar6 = CVmNetFile::readdir(this_00,(DIR *)((this->super_CVmObject).ext_ + 8));
      if ((int)pdVar6 == 0) {
        CVmRun::throw_new_class
                  (&G_interpreter_X,G_predef_X.file_open_exc,0,"error reading directory");
      }
    }
    if (-1 < (short)err_cur__.state_) {
      err_cur__.state_ = err_cur__.state_ | 0x8000;
      CVmNetFile::abandon(this_00);
    }
    peVar1 = err_cur__.prv_;
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    *puVar4 = peVar1;
    if ((err_cur__.state_ & 0x4001U) != 0) {
      puVar4 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(byte *)*puVar4 & 2) != 0) {
        plVar7 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar7 + 0x10));
      }
      pCVar2 = err_cur__.exc_;
      plVar7 = (long *)_ZTW11G_err_frame();
      *(CVmException **)(*plVar7 + 0x10) = pCVar2;
      err_rethrow();
    }
    if ((err_cur__.state_ & 2U) != 0) {
      free(err_cur__.exc_);
    }
    sp_ = sp_ + -(long)(int)uVar8;
  }
  return 1;
}

Assistant:

int CVmObjFileName::getp_listDir(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the filename; use the READ DIR access mode */
    vm_rcdesc rc(vmg_ "FileName.listDir",
                 metaclass_reg_->get_class_obj(vmg0_),
                 VMOFN_LISTDIR, G_stk->get(0), argc);
    CVmNetFile *netfile = CVmObjFile::get_filename_from_obj(
        vmg_ self, &rc, VMOBJFILE_ACCESS_READDIR,
        OSFTUNK, "application/octet-stream");
    
    err_try
    {
        /* get the directory listing */
        if (!netfile->readdir(vmg_ get_ext()->get_str(), retval))
            G_interpreter->throw_new_class(vmg_ G_predef->file_open_exc,
                                           0, "error reading directory");
    }